

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O2

int Fraig_FeedBackCompress(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Msat_IntVec_t *p_00;
  Fraig_Node_t *pFVar2;
  int iVar3;
  int iVar4;
  Fraig_NodeVec_t *pFVar5;
  Fraig_Node_t *pFVar6;
  void *__ptr;
  int *piVar7;
  Fraig_MemFixed_t *p_01;
  uint *puVar8;
  uint uVar9;
  int Entry;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  Fraig_Node_t **ppFVar18;
  ulong uVar19;
  Fraig_NodeVec_t *pFVar20;
  int i;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint *puVar25;
  
  iVar4 = p->nBTLimit;
  if ((iVar4 == -1) && (Fraig_FeedBackCheckTable(p), p->fDoSparse != 0)) {
    Fraig_FeedBackCheckTableF0(p);
  }
  pFVar1 = p->pTableF;
  p_00 = p->vPatsReal;
  pFVar5 = Fraig_NodeVecAlloc(100);
  for (lVar10 = 0; lVar10 < pFVar1->nBins; lVar10 = lVar10 + 1) {
    ppFVar18 = pFVar1->pBins + lVar10;
    while (pFVar2 = *ppFVar18, pFVar2 != (Fraig_Node_t *)0x0) {
      pFVar20 = p->vCones;
      pFVar20->nSize = 0;
      for (pFVar6 = pFVar2; pFVar6 != (Fraig_Node_t *)0x0; pFVar6 = pFVar6->pNextD) {
        Fraig_NodeVecPush(pFVar20,pFVar6);
        pFVar20 = p->vCones;
      }
      iVar3 = pFVar20->nSize;
      if (iVar3 < 0x15 && iVar3 != 1) {
        lVar13 = 1;
        for (lVar24 = 0; lVar14 = lVar13, lVar24 < iVar3; lVar24 = lVar24 + 1) {
          for (; (int)lVar14 < iVar3; lVar14 = lVar14 + 1) {
            iVar3 = Fraig_CompareSimInfoUnderMask
                              (pFVar20->pArray[lVar24],pFVar20->pArray[lVar14],p->iWordStart,0,
                               p->pSimsReal);
            if (iVar3 != 0) {
              pFVar6 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
              ppFVar18 = p->vCones->pArray;
              puVar8 = ppFVar18[lVar24]->puSimD;
              puVar25 = ppFVar18[lVar14]->puSimD;
              for (lVar17 = 0; lVar17 < p->iWordStart; lVar17 = lVar17 + 1) {
                (&pFVar6->Num)[lVar17] = ~p->pSimsReal[lVar17] & (puVar25[lVar17] ^ puVar8[lVar17]);
              }
              Fraig_NodeVecPush(pFVar5,pFVar6);
            }
            pFVar20 = p->vCones;
            iVar3 = pFVar20->nSize;
          }
          lVar13 = lVar13 + 1;
        }
      }
      ppFVar18 = &pFVar2->pNextF;
    }
  }
  if (p->fDoSparse != 0) {
    pFVar1 = p->pTableF0;
    uVar11 = 0;
    uVar15 = (ulong)(uint)pFVar1->nBins;
    if (pFVar1->nBins < 1) {
      uVar15 = uVar11;
    }
    for (; uVar11 != uVar15; uVar11 = uVar11 + 1) {
      ppFVar18 = pFVar1->pBins + uVar11;
      while (pFVar2 = *ppFVar18, pFVar2 != (Fraig_Node_t *)0x0) {
        pFVar2->uHashD = 0;
        uVar23 = 0;
        uVar19 = (ulong)(uint)p->iWordStart;
        if (p->iWordStart < 1) {
          uVar19 = uVar23;
        }
        for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
          uVar21 = (uint)uVar23 ^
                   (p->pSimsReal[uVar22] & pFVar2->puSimD[uVar22]) * s_FraigPrimes[uVar22];
          uVar23 = (ulong)uVar21;
          pFVar2->uHashD = uVar21;
        }
        ppFVar18 = &pFVar2->pNextF;
      }
    }
    Fraig_TableRehashF0(p,1);
    for (lVar10 = 0; lVar10 < pFVar1->nBins; lVar10 = lVar10 + 1) {
      ppFVar18 = pFVar1->pBins + lVar10;
      while (pFVar2 = *ppFVar18, pFVar2 != (Fraig_Node_t *)0x0) {
        pFVar20 = p->vCones;
        pFVar20->nSize = 0;
        for (pFVar6 = pFVar2; pFVar6 != (Fraig_Node_t *)0x0; pFVar6 = pFVar6->pNextD) {
          Fraig_NodeVecPush(pFVar20,pFVar6);
          pFVar20 = p->vCones;
        }
        iVar3 = pFVar20->nSize;
        if (iVar3 != 1) {
          lVar13 = 1;
          for (lVar24 = 0; lVar14 = lVar13, lVar24 < iVar3; lVar24 = lVar24 + 1) {
            for (; (int)lVar14 < iVar3; lVar14 = lVar14 + 1) {
              pFVar6 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
              ppFVar18 = p->vCones->pArray;
              puVar8 = ppFVar18[lVar24]->puSimD;
              puVar25 = ppFVar18[lVar14]->puSimD;
              for (lVar17 = 0; lVar17 < p->iWordStart; lVar17 = lVar17 + 1) {
                (&pFVar6->Num)[lVar17] = ~p->pSimsReal[lVar17] & (puVar25[lVar17] ^ puVar8[lVar17]);
              }
              Fraig_NodeVecPush(pFVar5,pFVar6);
              iVar3 = p->vCones->nSize;
            }
            lVar13 = lVar13 + 1;
          }
        }
        ppFVar18 = &pFVar2->pNextF;
      }
    }
  }
  uVar15 = (ulong)pFVar5->nSize;
  __ptr = malloc(uVar15 << 2);
  for (lVar10 = 0; lVar10 < (int)uVar15; lVar10 = lVar10 + 1) {
    iVar3 = Fraig_BitStringCountOnes((uint *)pFVar5->pArray[lVar10],p->iWordStart);
    *(int *)((long)__ptr + lVar10 * 4) = iVar3;
    uVar15 = (ulong)(uint)pFVar5->nSize;
  }
  Msat_IntVecReadSize(p_00);
  do {
    uVar21 = pFVar5->nSize;
    uVar15 = 0;
    if (0 < (int)uVar21) {
      uVar15 = (ulong)uVar21;
    }
    iVar3 = 1000000;
    Entry = -1;
    uVar19 = 0xffffffff;
    for (uVar11 = 0; iVar16 = (int)uVar19, uVar15 != uVar11; uVar11 = uVar11 + 1) {
      iVar16 = *(int *)((long)__ptr + uVar11 * 4);
      if (iVar16 != 0) {
        if (iVar16 == 1) {
          iVar16 = (int)uVar11;
          break;
        }
        if (iVar16 < iVar3) {
          uVar19 = uVar11 & 0xffffffff;
        }
        if (iVar16 <= iVar3) {
          iVar3 = iVar16;
        }
      }
    }
    if (iVar16 == -1) {
      for (lVar10 = 0; lVar10 < (int)uVar21; lVar10 = lVar10 + 1) {
        Fraig_MemFixedEntryRecycle(p->mmSims,(char *)pFVar5->pArray[lVar10]);
        uVar21 = pFVar5->nSize;
      }
      Fraig_NodeVecFree(pFVar5);
      free(__ptr);
      uVar21 = Msat_IntVecReadSize(p->vPatsReal);
      piVar7 = Msat_IntVecReadArray(p->vPatsReal);
      uVar12 = p->iPatsPerm + uVar21;
      uVar12 = (((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
      uVar11 = (ulong)uVar12;
      p->iWordStart = uVar12;
      pFVar5 = p->vInputs;
      uVar19 = 0;
      uVar15 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar15 = uVar19;
      }
      for (; (long)uVar19 < (long)pFVar5->nSize; uVar19 = uVar19 + 1) {
        pFVar2 = pFVar5->pArray[uVar19];
        puVar8 = pFVar2->puSimD;
        for (lVar10 = (long)p->iWordPerm; lVar10 < (int)uVar11; lVar10 = lVar10 + 1) {
          p->pSimsTemp[lVar10] = 0;
          uVar11 = (ulong)(uint)p->iWordStart;
        }
        for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
          if ((puVar8[piVar7[uVar11] >> 5] >> (piVar7[uVar11] & 0x1fU) & 1) != 0) {
            lVar10 = (uint)p->iPatsPerm + uVar11;
            iVar3 = (int)lVar10;
            puVar25 = puVar8;
            if (p->iWordPerm * 0x20 <= iVar3) {
              puVar25 = p->pSimsTemp;
            }
            puVar25[iVar3 >> 5] = puVar25[iVar3 >> 5] | 1 << ((byte)lVar10 & 0x1f);
          }
        }
        lVar10 = (long)p->iWordPerm;
        while( true ) {
          uVar12 = p->iWordStart;
          uVar11 = (ulong)(int)uVar12;
          if ((long)uVar11 <= lVar10) break;
          puVar8[lVar10] = p->pSimsTemp[lVar10];
          lVar10 = lVar10 + 1;
        }
        uVar23 = 0;
        uVar22 = 0;
        if (0 < (int)uVar12) {
          uVar22 = (ulong)uVar12;
        }
        uVar12 = 0;
        for (; uVar22 != uVar23; uVar23 = uVar23 + 1) {
          uVar12 = uVar12 ^ s_FraigPrimes[uVar23] * puVar8[uVar23];
        }
        pFVar2->uHashD = uVar12;
      }
      p->iWordPerm = (int)uVar11;
      uVar21 = p->iPatsPerm + uVar21;
      p->iPatsPerm = uVar21;
      if ((int)uVar11 != (((int)uVar21 >> 5) + 1) - (uint)((uVar21 & 0x1f) == 0)) {
        __assert_fail("p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,0x14e,"int Fraig_FeedBackCompress(Fraig_Man_t *)");
      }
      for (lVar10 = 1; lVar10 < p->vNodes->nSize; lVar10 = lVar10 + 1) {
        iVar3 = Fraig_NodeIsAnd(p->vNodes->pArray[lVar10]);
        if (iVar3 != 0) {
          pFVar2 = p->vNodes->pArray[lVar10];
          pFVar2->uHashD = 0;
          Fraig_NodeSimulate(pFVar2,0,p->iWordPerm,0);
        }
      }
      if (iVar4 == -1) {
        Fraig_FeedBackCheckTable(p);
      }
      if ((p->fDoSparse != 0) && (Fraig_TableRehashF0(p,0), iVar4 == -1)) {
        Fraig_FeedBackCheckTableF0(p);
      }
      if (p->nWordsDyna < p->iWordPerm + 5) {
        iVar4 = p->nWordsDyna * 2;
        p->nWordsDyna = iVar4;
        p_01 = Fraig_MemFixedStart((iVar4 + p->nWordsRand) * 4);
        pFVar2 = p->pConst1;
        puVar8 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        pFVar2->puSimR = puVar8;
        iVar4 = p->nWordsRand;
        pFVar2->puSimD = puVar8 + iVar4;
        memset(puVar8,0,(long)iVar4 << 2);
        memset(pFVar2->puSimD,0,(long)p->nWordsDyna << 2);
        for (lVar10 = 0; lVar10 < p->vInputs->nSize; lVar10 = lVar10 + 1) {
          pFVar2 = p->vInputs->pArray[lVar10];
          puVar8 = (uint *)Fraig_MemFixedEntryFetch(p_01);
          memmove(puVar8,pFVar2->puSimR,((long)p->iWordStart + (long)p->nWordsRand) * 4);
          pFVar2->puSimR = puVar8;
          pFVar2->puSimD = puVar8 + p->nWordsRand;
        }
        Fraig_MemFixedStop(p->mmSims,0);
        p->mmSims = p_01;
        for (lVar10 = 1; lVar10 < p->vNodes->nSize; lVar10 = lVar10 + 1) {
          pFVar2 = p->vNodes->pArray[lVar10];
          iVar4 = Fraig_NodeIsAnd(pFVar2);
          if (iVar4 != 0) {
            puVar8 = (uint *)Fraig_MemFixedEntryFetch(p_01);
            pFVar2->puSimR = puVar8;
            iVar4 = p->nWordsRand;
            pFVar2->puSimD = puVar8 + iVar4;
            uVar21 = pFVar2->uHashR;
            pFVar2->uHashR = 0;
            Fraig_NodeSimulate(pFVar2,0,iVar4,1);
            if (uVar21 != pFVar2->uHashR) {
              __assert_fail("uSignOld == pNode->uHashR",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                            ,0x2f8,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
            }
            uVar21 = pFVar2->uHashD;
            pFVar2->uHashD = 0;
            Fraig_NodeSimulate(pFVar2,0,p->iWordStart,0);
            if (uVar21 != pFVar2->uHashD) {
              __assert_fail("uSignOld == pNode->uHashD",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                            ,0x2fd,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
            }
          }
        }
        puVar8 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsReal = puVar8;
        memset(puVar8,0,(long)p->nWordsDyna << 2);
        puVar8 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsTemp = puVar8;
        puVar8 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsDiff = puVar8;
      }
      Msat_IntVecClear(p->vPatsReal);
      memset(p->pSimsReal,0,(long)p->nWordsDyna << 2);
      for (lVar10 = 0; lVar10 < p->iWordPerm; lVar10 = lVar10 + 1) {
        p->pSimsReal[lVar10] = 0xffffffff;
      }
      lVar10 = (long)p->iPatsPerm % 0x20;
      if (0 < (int)lVar10) {
        p->pSimsReal[(long)p->iWordPerm + -1] = 0xffffffff >> (-(char)lVar10 & 0x1fU);
      }
      return p->iWordStart;
    }
    ppFVar18 = pFVar5->pArray;
    iVar3 = 0;
    uVar21 = p->iWordStart;
    if (p->iWordStart < 1) {
      uVar21 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar21; uVar11 = uVar11 + 1) {
      uVar12 = (&ppFVar18[iVar16]->Num)[uVar11];
      if (uVar12 != 0) {
        for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
          if ((uVar12 >> (uVar9 & 0x1f) & 1) != 0) {
            Entry = uVar9 - iVar3;
            goto LAB_0072eccf;
          }
        }
      }
      iVar3 = iVar3 + -0x20;
    }
LAB_0072eccf:
    for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
      if (((&ppFVar18[uVar11]->Num)[Entry >> 5] & 1 << ((byte)Entry & 0x1f)) != 0) {
        *(undefined4 *)((long)__ptr + uVar11 * 4) = 0;
      }
    }
    Msat_IntVecPush(p_00,Entry);
  } while( true );
}

Assistant:

int Fraig_FeedBackCompress( Fraig_Man_t * p )
{
    unsigned * pSims;
    unsigned uHash;
    int i, w, t, nPats, * pPats;
    int fPerformChecks = (p->nBTLimit == -1);

    // solve the covering problem
    if ( fPerformChecks )
    {
        Fraig_FeedBackCheckTable( p );
        if ( p->fDoSparse ) 
            Fraig_FeedBackCheckTableF0( p );
    }

    // solve the covering problem
    Fraig_FeedBackCovering( p, p->vPatsReal );


    // get the number of additional patterns
    nPats = Msat_IntVecReadSize( p->vPatsReal );
    pPats = Msat_IntVecReadArray( p->vPatsReal );
    // get the new starting word
    p->iWordStart = FRAIG_NUM_WORDS( p->iPatsPerm + nPats );

    // set the simulation info for the PIs
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        // get hold of the simulation info for this PI
        pSims = p->vInputs->pArray[i]->puSimD;
        // clean the storage for the new patterns
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            p->pSimsTemp[w] = 0;
        // set the patterns
        for ( t = 0; t < nPats; t++ )
            if ( Fraig_BitStringHasBit( pSims, pPats[t] ) )
            {
                // check if this pattern falls into temporary storage
                if ( p->iPatsPerm + t < p->iWordPerm * 32 )
                    Fraig_BitStringSetBit( pSims, p->iPatsPerm + t );
                else
                    Fraig_BitStringSetBit( p->pSimsTemp, p->iPatsPerm + t );
            }
        // copy the pattern 
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            pSims[w] = p->pSimsTemp[w];
        // recompute the hashing info
        uHash = 0;
        for ( w = 0; w < p->iWordStart; w++ )
            uHash ^= pSims[w] * s_FraigPrimes[w];
        p->vInputs->pArray[i]->uHashD = uHash;
    }

    // update info about the permanently stored patterns
    p->iWordPerm = p->iWordStart;
    p->iPatsPerm += nPats;
    assert( p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm ) );

    // resimulate and recompute the hash values
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
        {
            p->vNodes->pArray[i]->uHashD = 0;
            Fraig_NodeSimulate( p->vNodes->pArray[i], 0, p->iWordPerm, 0 );
        }

    // double-check that the nodes are still distinguished
    if ( fPerformChecks )
        Fraig_FeedBackCheckTable( p );

    // rehash the values in the F0 table
    if ( p->fDoSparse ) 
    {
        Fraig_TableRehashF0( p, 0 );
        if ( fPerformChecks )
            Fraig_FeedBackCheckTableF0( p );
    }

    // check if we need to resize the simulation info
    // if less than FRAIG_WORDS_STORE words are left, reallocate simulation info
    if ( p->iWordPerm + FRAIG_WORDS_STORE > p->nWordsDyna )
        Fraig_ReallocateSimulationInfo( p );

    // set the real patterns
    Msat_IntVecClear( p->vPatsReal );
    memset( p->pSimsReal, 0, sizeof(unsigned)*p->nWordsDyna );
    for ( w = 0; w < p->iWordPerm; w++ )
        p->pSimsReal[w] = FRAIG_FULL;
    if ( p->iPatsPerm % 32 > 0 )
        p->pSimsReal[p->iWordPerm-1] = FRAIG_MASK( p->iPatsPerm % 32 );
//    printf( "The number of permanent words = %d.\n", p->iWordPerm );
    return p->iWordStart;
}